

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::ParameterizedTestFactory<google::protobuf::SingleArena_GetSet_Test>::CreateTest
          (ParameterizedTestFactory<google::protobuf::SingleArena_GetSet_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<bool>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_018d1ef0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__SingleArena_GetSet_Test_018d1f30;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }